

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

Matrix<double,_2,_3> * __thiscall
gl4cts::Math::outerProduct<3,2>
          (Matrix<double,_2,_3> *__return_storage_ptr__,Math *this,Vector<double,_2> *left,
          Vector<double,_3> *right)

{
  int row;
  long lVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  undefined1 *puVar5;
  bool bVar6;
  uint uVar7;
  Matrix<double,_2,_1> left_mat;
  Matrix<double,_1,_3> right_mat;
  Matrix<double,_2,_1> local_78;
  Matrix<double,_1,_3> local_68;
  undefined1 local_48 [48];
  
  lVar1 = 0;
  do {
    uVar7 = 0x3ff00000;
    if (lVar1 != 0) {
      uVar7 = 0;
    }
    local_78.m_data.m_data[0].m_data[lVar1] = (double)((ulong)uVar7 << 0x20);
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  lVar1 = 0;
  do {
    uVar7 = 0x3ff00000;
    if (lVar1 != 0) {
      uVar7 = 0;
    }
    local_68.m_data.m_data[lVar1].m_data[0] = (double)((ulong)uVar7 << 0x20);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  lVar2 = 0;
  pdVar3 = (double *)__return_storage_ptr__;
  lVar1 = 0;
  do {
    lVar4 = 0;
    do {
      uVar7 = 0x3ff00000;
      if (lVar2 != lVar4) {
        uVar7 = 0;
      }
      *(ulong *)((long)pdVar3 + lVar4) = (ulong)uVar7 << 0x20;
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x30);
    pdVar3 = pdVar3 + 1;
    lVar2 = lVar2 + 0x10;
    bVar6 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar6);
  local_78.m_data.m_data[0].m_data[0] = *(double *)this;
  local_78.m_data.m_data[0].m_data[1] = *(double *)(this + 8);
  local_68.m_data.m_data[0].m_data[0] = (double  [1])left->m_data[0];
  local_68.m_data.m_data[1].m_data[0] = (double  [1])left->m_data[1];
  local_68.m_data.m_data[2].m_data[0] = (double  [1])left[1].m_data[0];
  puVar5 = local_48;
  tcu::operator*(&local_78,&local_68);
  lVar1 = 0;
  pdVar3 = (double *)__return_storage_ptr__;
  do {
    lVar2 = 0;
    do {
      *(undefined8 *)((long)pdVar3 + lVar2) = *(undefined8 *)(puVar5 + lVar2);
      lVar2 = lVar2 + 0x10;
    } while (lVar2 != 0x30);
    pdVar3 = pdVar3 + 1;
    puVar5 = puVar5 + 8;
    bVar6 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar6);
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Rows, Cols> outerProduct(const tcu::Vector<glw::GLdouble, Rows>& left,
														   const tcu::Vector<glw::GLdouble, Cols>& right)
{
	tcu::Matrix<glw::GLdouble, Rows, 1>	left_mat;
	tcu::Matrix<glw::GLdouble, 1, Cols>	right_mat;
	tcu::Matrix<glw::GLdouble, Rows, Cols> result;

	for (glw::GLuint i = 0; i < Rows; ++i)
	{
		left_mat(i, 0) = left[i];
	}

	for (glw::GLuint i = 0; i < Cols; ++i)
	{
		right_mat(0, i) = right[i];
	}

	result = left_mat * right_mat;

	return result;
}